

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopl_file.c
# Opt level: O0

void WOPL_writeInstrument
               (WOPLInstrument *ins,uint8_t *cursor,uint16_t version,uint8_t has_sounding_delays)

{
  long lVar1;
  size_t off;
  int l;
  uint8_t has_sounding_delays_local;
  uint16_t version_local;
  uint8_t *cursor_local;
  WOPLInstrument *ins_local;
  
  *(undefined8 *)cursor = *(undefined8 *)ins->inst_name;
  *(undefined8 *)(cursor + 8) = *(undefined8 *)(ins->inst_name + 8);
  *(undefined8 *)(cursor + 0x10) = *(undefined8 *)(ins->inst_name + 0x10);
  *(undefined8 *)(cursor + 0x18) = *(undefined8 *)(ins->inst_name + 0x18);
  cursor[0x20] = '\0';
  fromSint16BE(ins->note_offset1,cursor + 0x20);
  fromSint16BE(ins->note_offset2,cursor + 0x22);
  cursor[0x24] = ins->midi_velocity_offset;
  cursor[0x25] = ins->second_voice_detune;
  cursor[0x26] = ins->percussion_key_number;
  cursor[0x27] = ins->inst_flags;
  cursor[0x28] = ins->fb_conn1_C0;
  cursor[0x29] = ins->fb_conn2_C0;
  for (off._0_4_ = 0; (int)off < 4; off._0_4_ = (int)off + 1) {
    lVar1 = (long)(int)off * 5;
    cursor[lVar1 + 0x2a] = ins->operators[(int)off].avekf_20;
    cursor[lVar1 + 0x2b] = ins->operators[(int)off].ksl_l_40;
    cursor[lVar1 + 0x2c] = ins->operators[(int)off].atdec_60;
    cursor[lVar1 + 0x2d] = ins->operators[(int)off].susrel_80;
    cursor[lVar1 + 0x2e] = ins->operators[(int)off].waveform_E0;
  }
  if ((2 < version) && (has_sounding_delays != '\0')) {
    fromUint16BE(ins->delay_on_ms,cursor + 0x3e);
    fromUint16BE(ins->delay_off_ms,cursor + 0x40);
  }
  return;
}

Assistant:

static void WOPL_writeInstrument(WOPLInstrument *ins, uint8_t *cursor, uint16_t version, uint8_t has_sounding_delays)
{
    int l;
    memcpy((char*)cursor, ins->inst_name, 32);
    cursor[32] = '\0';
    fromSint16BE(ins->note_offset1, cursor + 32);
    fromSint16BE(ins->note_offset2, cursor + 34);
    cursor[36] = (uint8_t)ins->midi_velocity_offset;
    cursor[37] = (uint8_t)ins->second_voice_detune;
    cursor[38] = ins->percussion_key_number;
    cursor[39] = ins->inst_flags;
    cursor[40] = ins->fb_conn1_C0;
    cursor[41] = ins->fb_conn2_C0;
    for(l = 0; l < 4; l++)
    {
        size_t off = 42 + (size_t)(l) * 5;
        cursor[off + 0] = ins->operators[l].avekf_20;
        cursor[off + 1] = ins->operators[l].ksl_l_40;
        cursor[off + 2] = ins->operators[l].atdec_60;
        cursor[off + 3] = ins->operators[l].susrel_80;
        cursor[off + 4] = ins->operators[l].waveform_E0;
    }
    if((version >= 3) && has_sounding_delays)
    {
        fromUint16BE(ins->delay_on_ms, cursor + 62);
        fromUint16BE(ins->delay_off_ms, cursor + 64);
    }
}